

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Swap<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
::TestBody(Swap<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
           *this)

{
  pointer *ppiVar1;
  bool bVar2;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> bVar3;
  char *pcVar4;
  vector<int,_std::allocator<int>_> *container;
  UnorderedElementsAreArrayMatcher<int> *matcher;
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  *s;
  vector<int,_std::allocator<int>_> *container_00;
  UnorderedElementsAreArrayMatcher<int> *matcher_00;
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  *s_00;
  vector<int,_std::allocator<int>_> *container_01;
  UnorderedElementsAreArrayMatcher<int> *matcher_01;
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  *s_01;
  vector<int,_std::allocator<int>_> *container_02;
  UnorderedElementsAreArrayMatcher<int> *matcher_02;
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  *s_02;
  AssertHelper local_ba8;
  Message local_ba0;
  vector<int,_std::allocator<int>_> local_b98;
  UnorderedElementsAreArrayMatcher<int> local_b80;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> local_b60
  ;
  undefined1 local_b40 [8];
  AssertionResult gtest_ar_3;
  Message local_b28;
  vector<int,_std::allocator<int>_> local_b20;
  UnorderedElementsAreArrayMatcher<int> local_b08;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> local_ae8
  ;
  undefined1 local_ac8 [8];
  AssertionResult gtest_ar_2;
  Message local_ab0;
  vector<int,_std::allocator<int>_> local_aa8;
  UnorderedElementsAreArrayMatcher<int> local_a90;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> local_a70
  ;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar_1;
  Message local_a38;
  vector<int,_std::allocator<int>_> local_a30;
  UnorderedElementsAreArrayMatcher<int> local_a18;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> local_9f8
  ;
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_9c0;
  StatefulTestingHash local_9b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_9b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_9a8;
  undefined1 local_9a0 [8];
  TypeParam m2;
  StatefulTestingEqual local_518;
  StatefulTestingHash local_510;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_508;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_500;
  undefined1 local_4f8 [8];
  TypeParam m1;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  Swap<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  ppiVar1 = &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)ppiVar1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
  bVar3 = std::back_inserter<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)ppiVar1);
  std::
  generate_n<std::back_insert_iterator<std::vector<int,std::allocator<int>>>,int,phmap::priv::hash_internal::Generator<int,void>>
            (bVar3.container,5);
  bVar3 = std::back_inserter<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)local_40);
  m1.
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       std::
       generate_n<std::back_insert_iterator<std::vector<int,std::allocator<int>>>,int,phmap::priv::hash_internal::Generator<int,void>>
                 (bVar3.container,5);
  ppiVar1 = &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  local_500._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)ppiVar1);
  local_508._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)ppiVar1);
  local_510.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_510);
  local_518.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_518);
  Alloc<int>::Alloc((Alloc<int> *)
                    ((long)&m2.
                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                            .sets_._M_elems[0xf].set_.settings_.
                            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    + 0x18),0);
  parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>
  ::parallel_hash_set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>
              *)local_4f8,local_500,local_508,0,&local_510,&local_518,
             (allocator_type *)
             ((long)&m2.
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                     .sets_._M_elems[0xf].set_.settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
             + 0x18));
  Alloc<int>::~Alloc((Alloc<int> *)
                     ((long)&m2.
                             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                             .sets_._M_elems[0xf].set_.settings_.
                             super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                     + 0x18));
  local_9a8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_40);
  local_9b0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_40);
  local_9b8.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_9b8);
  local_9c0.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_9c0);
  Alloc<int>::Alloc((Alloc<int> *)&gtest_ar.message_,0);
  parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>
  ::parallel_hash_set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>
              *)local_9a0,local_9a8,local_9b0,0,&local_9b8,&local_9c0,
             (allocator_type *)&gtest_ar.message_);
  Alloc<int>::~Alloc((Alloc<int> *)&gtest_ar.message_);
  testing::UnorderedElementsAreArray<std::vector<int,std::allocator<int>>>
            (&local_a18,
             (testing *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
            (&local_9f8,(internal *)&local_a18,matcher);
  keys<phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>>
            (&local_a30,(priv *)local_4f8,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
  operator()(local_9d8,(char *)&local_9f8,(vector<int,_std::allocator<int>_> *)"keys(m1)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_a30);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
  ~PredicateFormatterFromMatcher(&local_9f8);
  testing::internal::UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher
            (&local_a18);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar2) {
    testing::Message::Message(&local_a38);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0xab,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  testing::UnorderedElementsAreArray<std::vector<int,std::allocator<int>>>
            (&local_a90,(testing *)local_40,container_00);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
            (&local_a70,(internal *)&local_a90,matcher_00);
  keys<phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>>
            (&local_aa8,(priv *)local_9a0,s_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
  operator()(local_a50,(char *)&local_a70,(vector<int,_std::allocator<int>_> *)"keys(m2)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_aa8);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
  ~PredicateFormatterFromMatcher(&local_a70);
  testing::internal::UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher
            (&local_a90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar2) {
    testing::Message::Message(&local_ab0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0xac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::swap<phmap::NullMutex>
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
              *)local_4f8,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
              *)local_9a0);
  testing::UnorderedElementsAreArray<std::vector<int,std::allocator<int>>>
            (&local_b08,(testing *)local_40,container_01);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
            (&local_ae8,(internal *)&local_b08,matcher_01);
  keys<phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>>
            (&local_b20,(priv *)local_4f8,s_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
  operator()(local_ac8,(char *)&local_ae8,(vector<int,_std::allocator<int>_> *)"keys(m1)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_b20);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
  ~PredicateFormatterFromMatcher(&local_ae8);
  testing::internal::UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher
            (&local_b08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac8);
  if (!bVar2) {
    testing::Message::Message(&local_b28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_ac8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0xae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac8);
  testing::UnorderedElementsAreArray<std::vector<int,std::allocator<int>>>
            (&local_b80,
             (testing *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,container_02);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
            (&local_b60,(internal *)&local_b80,matcher_02);
  keys<phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>>
            (&local_b98,(priv *)local_9a0,s_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
  operator()(local_b40,(char *)&local_b60,(vector<int,_std::allocator<int>_> *)"keys(m2)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_b98);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
  ~PredicateFormatterFromMatcher(&local_b60);
  testing::internal::UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher
            (&local_b80);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b40);
  if (!bVar2) {
    testing::Message::Message(&local_ba0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b40);
    testing::internal::AssertHelper::AssertHelper
              (&local_ba8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0xaf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_ba8,&local_ba0);
    testing::internal::AssertHelper::~AssertHelper(&local_ba8);
    testing::Message::~Message(&local_ba0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b40);
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)local_9a0);
  parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)local_4f8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Swap) {
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> v1;
  std::vector<T> v2;
  std::generate_n(std::back_inserter(v1), 5, hash_internal::Generator<T>());
  std::generate_n(std::back_inserter(v2), 5, hash_internal::Generator<T>());
  TypeParam m1(v1.begin(), v1.end());
  TypeParam m2(v2.begin(), v2.end());
  EXPECT_THAT(keys(m1), ::testing::UnorderedElementsAreArray(v1));
  EXPECT_THAT(keys(m2), ::testing::UnorderedElementsAreArray(v2));
  m1.swap(m2);
  EXPECT_THAT(keys(m1), ::testing::UnorderedElementsAreArray(v2));
  EXPECT_THAT(keys(m2), ::testing::UnorderedElementsAreArray(v1));
}